

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::BeginViewportSideBar
               (char *name,ImGuiViewport *viewport_p,ImGuiDir dir,float axis_size,
               ImGuiWindowFlags window_flags)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  bool bVar4;
  ImGuiWindow *pIVar5;
  ImVec2 IVar6;
  float fVar7;
  float fVar8;
  ImVec2 pos;
  ImVec2 size;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  undefined8 local_40;
  ImVec2 local_38;
  
  pIVar5 = FindWindowByName(name);
  if ((pIVar5 == (ImGuiWindow *)0x0) || (pIVar5->BeginCount == 0)) {
    if (viewport_p == (ImGuiViewport *)0x0) {
      viewport_p = GetMainViewport();
    }
    uVar1 = *(undefined8 *)&viewport_p[3].WorkPos.y;
    uVar2 = *(undefined8 *)&viewport_p[3].WorkSize.y;
    fVar7 = (float)uVar1;
    IVar6.x = (viewport_p->Pos).x + fVar7;
    fVar8 = (float)((ulong)uVar1 >> 0x20);
    IVar6.y = (viewport_p->Pos).y + fVar8;
    fVar7 = ((viewport_p->Size).x - fVar7) + (float)uVar2;
    fVar8 = ((viewport_p->Size).y - fVar8) + (float)((ulong)uVar2 >> 0x20);
    fVar7 = (float)(-(uint)(0.0 < fVar7) & (uint)fVar7) + IVar6.x;
    fVar8 = (float)(-(uint)(0.0 < fVar8) & (uint)fVar8) + IVar6.y;
    local_40 = CONCAT44(fVar8,fVar7);
    local_58 = IVar6;
    if ((dir | 2U) == 3) {
      uVar3 = (ulong)((dir & 0xfffffffeU) == 2);
      (&local_58.x)[uVar3] = *(float *)((long)&local_40 + uVar3 * 4) - axis_size;
    }
    bVar4 = (dir & 0xfffffffeU) == 2;
    local_50.x = fVar7 - IVar6.x;
    local_50.y = fVar8 - IVar6.y;
    (&local_50.x)[bVar4] = axis_size;
    local_38.x = 0.0;
    local_38.y = 0.0;
    SetNextWindowPos(&local_58,0,&local_38);
    SetNextWindowSize(&local_50,0);
    if ((dir & 0xfffffffdU) == 0) {
      (&viewport_p[3].WorkPos.y)[bVar4] = axis_size + (&viewport_p[3].WorkPos.y)[bVar4];
    }
    else if ((dir | 2U) == 3) {
      (&viewport_p[3].WorkSize.y)[bVar4] = (&viewport_p[3].WorkSize.y)[bVar4] - axis_size;
    }
  }
  PushStyleVar(3,0.0);
  local_48.x = 0.0;
  local_48.y = 0.0;
  PushStyleVar(5,&local_48);
  bVar4 = Begin(name,(bool *)0x0,window_flags | 7);
  PopStyleVar(2);
  return bVar4;
}

Assistant:

bool ImGui::BeginViewportSideBar(const char* name, ImGuiViewport* viewport_p, ImGuiDir dir, float axis_size, ImGuiWindowFlags window_flags)
{
    IM_ASSERT(dir != ImGuiDir_None);

    ImGuiWindow* bar_window = FindWindowByName(name);
    if (bar_window == NULL || bar_window->BeginCount == 0)
    {
        // Calculate and set window size/position
        ImGuiViewportP* viewport = (ImGuiViewportP*)(void*)(viewport_p ? viewport_p : GetMainViewport());
        ImRect avail_rect = viewport->GetBuildWorkRect();
        ImGuiAxis axis = (dir == ImGuiDir_Up || dir == ImGuiDir_Down) ? ImGuiAxis_Y : ImGuiAxis_X;
        ImVec2 pos = avail_rect.Min;
        if (dir == ImGuiDir_Right || dir == ImGuiDir_Down)
            pos[axis] = avail_rect.Max[axis] - axis_size;
        ImVec2 size = avail_rect.GetSize();
        size[axis] = axis_size;
        SetNextWindowPos(pos);
        SetNextWindowSize(size);

        // Report our size into work area (for next frame) using actual window size
        if (dir == ImGuiDir_Up || dir == ImGuiDir_Left)
            viewport->BuildWorkOffsetMin[axis] += axis_size;
        else if (dir == ImGuiDir_Down || dir == ImGuiDir_Right)
            viewport->BuildWorkOffsetMax[axis] -= axis_size;
    }

    window_flags |= ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove;
    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowMinSize, ImVec2(0, 0)); // Lift normal size constraint
    bool is_open = Begin(name, NULL, window_flags);
    PopStyleVar(2);

    return is_open;
}